

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  byte bVar1;
  Parse *pPVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  anon_union_8_13_7e920dcd_for_p4 *paVar6;
  uint uVar7;
  
  uVar5 = *pMaxFuncArgs;
  pPVar2 = p->pParse;
  piVar3 = pPVar2->aLabel;
  *(ushort *)&p->field_0x8c = (ushort)*(undefined4 *)&p->field_0x8c & 0xff3f | 0x40;
  if (0 < p->nOp) {
    iVar4 = p->nOp + 1;
    paVar6 = &p->aOp->p4;
    do {
      bVar1 = ((Op *)(paVar6 + -2))->opcode;
      switch(bVar1) {
      case 1:
      case 10:
        if ((int)uVar5 <= (int)(uint)*(u8 *)((long)paVar6 + -0xd)) {
          uVar5 = (uint)*(u8 *)((long)paVar6 + -0xd);
        }
        break;
      case 4:
        if (paVar6[-1].i != 0) {
          p->field_0x8c = p->field_0x8c & 0xbf;
        }
      case 2:
      case 3:
        p->field_0x8c = p->field_0x8c | 0x80;
        break;
      case 5:
      case 7:
      case 9:
        paVar6->p = sqlite3BtreeNext;
        goto LAB_0013f0de;
      case 6:
      case 8:
        paVar6->p = sqlite3BtreePrevious;
LAB_0013f0de:
        *(char *)((long)paVar6 + -0xf) = -0x13;
        break;
      case 0xb:
      case 0xc:
      case 0xd:
        *(ushort *)&p->field_0x8c = (ushort)*(undefined4 *)&p->field_0x8c & 0xff3f | 0x80;
        break;
      case 0xe:
        uVar7 = *(uint *)((long)paVar6 + -0x24);
        goto LAB_0013f0ee;
      case 0xf:
        uVar7 = paVar6[-1].i;
LAB_0013f0ee:
        if ((int)uVar5 < (int)uVar7) {
          uVar5 = uVar7;
        }
      }
      bVar1 = ""[bVar1];
      *(byte *)((long)paVar6 + -0xe) = bVar1;
      if (((bVar1 & 1) != 0) && (paVar6[-1].i < 0)) {
        paVar6[-1].i = piVar3[(uint)~paVar6[-1].i];
      }
      iVar4 = iVar4 + -1;
      paVar6 = paVar6 + 3;
    } while (1 < iVar4);
  }
  sqlite3DbFree(p->db,pPVar2->aLabel);
  pPVar2->aLabel = (int *)0x0;
  pPVar2->nLabel = 0;
  *pMaxFuncArgs = uVar5;
  return;
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int i;
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  for(pOp=p->aOp, i=p->nOp-1; i>=0; i--, pOp++){
    u8 opcode = pOp->opcode;

    /* NOTE: Be sure to update mkopcodeh.awk when adding or removing
    ** cases from this switch! */
    switch( opcode ){
      case OP_Function:
      case OP_AggStep: {
        if( pOp->p5>nMaxArgs ) nMaxArgs = pOp->p5;
        break;
      }
      case OP_Transaction: {
        if( pOp->p2!=0 ) p->readOnly = 0;
        /* fall thru */
      }
      case OP_AutoCommit:
      case OP_Savepoint: {
        p->bIsReader = 1;
        break;
      }
#ifndef SQLITE_OMIT_WAL
      case OP_Checkpoint:
#endif
      case OP_Vacuum:
      case OP_JournalMode: {
        p->readOnly = 0;
        p->bIsReader = 1;
        break;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      case OP_VUpdate: {
        if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
        break;
      }
      case OP_VFilter: {
        int n;
        assert( p->nOp - i >= 3 );
        assert( pOp[-1].opcode==OP_Integer );
        n = pOp[-1].p1;
        if( n>nMaxArgs ) nMaxArgs = n;
        break;
      }
#endif
      case OP_Next:
      case OP_NextIfOpen:
      case OP_SorterNext: {
        pOp->p4.xAdvance = sqlite3BtreeNext;
        pOp->p4type = P4_ADVANCE;
        break;
      }
      case OP_Prev:
      case OP_PrevIfOpen: {
        pOp->p4.xAdvance = sqlite3BtreePrevious;
        pOp->p4type = P4_ADVANCE;
        break;
      }
    }

    pOp->opflags = sqlite3OpcodeProperty[opcode];
    if( (pOp->opflags & OPFLG_JUMP)!=0 && pOp->p2<0 ){
      assert( -1-pOp->p2<pParse->nLabel );
      pOp->p2 = aLabel[-1-pOp->p2];
    }
  }
  sqlite3DbFree(p->db, pParse->aLabel);
  pParse->aLabel = 0;
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}